

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk2dfd.c
# Opt level: O2

uint32_t * vk2dfd(VkFormat format)

{
  uint32_t *puVar1;
  VkSuffix VVar2;
  VkSuffix bdepth;
  int *channels_00;
  VkSuffix VVar3;
  int *bits_00;
  int stencilBits;
  VkSuffix VVar4;
  int iVar5;
  VkSuffix VStackY_70;
  int bits [2];
  int channels [2];
  int shiftBits [4];
  int position_ys [4];
  int position_xs [4];
  
  switch(format) {
  case VK_FORMAT_R4G4_UNORM_PACK8:
    channels[0] = 1;
    channels[1] = 0;
    bits[0] = 4;
    bits[1] = 4;
    VVar4 = s_USCALED;
    goto LAB_001ea8b8;
  case VK_FORMAT_R4G4B4A4_UNORM_PACK16:
    channels[0] = 3;
    channels[1] = 2;
    goto LAB_001ea89f;
  case VK_FORMAT_B4G4R4A4_UNORM_PACK16:
    channels[0] = 3;
    channels[1] = 0;
LAB_001ea89f:
    bits[0] = 4;
    bits[1] = 4;
    goto LAB_001ea8ae;
  case VK_FORMAT_R5G6B5_UNORM_PACK16:
    channels[0] = 2;
    channels[1] = 1;
    goto LAB_001e9df3;
  case VK_FORMAT_B5G6R5_UNORM_PACK16:
    channels[0] = 0;
    channels[1] = 1;
LAB_001e9df3:
    bits[0] = 5;
    bits[1] = 6;
    VVar4 = s_SSCALED;
    goto LAB_001ea8b8;
  case VK_FORMAT_R5G5B5A1_UNORM_PACK16:
    channels[1] = 2;
    goto LAB_001ea7e0;
  case VK_FORMAT_B5G5R5A1_UNORM_PACK16:
    channels[1] = 0;
LAB_001ea7e0:
    channels[0] = 3;
    bits[0] = 1;
    bits[1] = 5;
    goto LAB_001ea8ae;
  case VK_FORMAT_A1R5G5B5_UNORM_PACK16:
    channels[0] = 2;
LAB_001ea84b:
    channels[1] = 1;
    bits[0] = 5;
    bits[1] = 5;
    goto LAB_001ea8ae;
  case VK_FORMAT_R8_UNORM:
    VStackY_70 = s_SNORM;
    VVar4 = VStackY_70;
    goto LAB_001ea746;
  case VK_FORMAT_R8_SNORM:
    VStackY_70 = s_SNORM;
    VVar4 = VStackY_70;
    goto LAB_001ea783;
  case VK_FORMAT_R8_USCALED:
    VVar3 = s_SNORM;
    VStackY_70 = s_USCALED;
    VVar4 = VVar3;
    break;
  case VK_FORMAT_R8_SSCALED:
    VVar3 = s_SNORM;
    goto LAB_001ea793;
  case VK_FORMAT_R8_UINT:
    VVar3 = s_SNORM;
    goto LAB_001ea704;
  case VK_FORMAT_R8_SINT:
    VVar3 = s_SNORM;
    goto LAB_001ea3a2;
  case VK_FORMAT_R8_SRGB:
    VVar3 = s_SNORM;
    VStackY_70 = s_SRGB;
    VVar4 = VVar3;
    break;
  case VK_FORMAT_R8G8_UNORM:
    VVar4 = s_USCALED;
    goto LAB_001e9f19;
  case VK_FORMAT_R8G8_SNORM:
    VVar4 = s_USCALED;
    goto LAB_001ea77d;
  case VK_FORMAT_R8G8_USCALED:
    VVar3 = s_SNORM;
    VStackY_70 = s_USCALED;
    goto LAB_001ea812;
  case VK_FORMAT_R8G8_SSCALED:
    VVar4 = s_USCALED;
    goto LAB_001ea828;
  case VK_FORMAT_R8G8_UINT:
    VVar4 = s_USCALED;
    goto LAB_001ea805;
  case VK_FORMAT_R8G8_SINT:
    VVar4 = s_USCALED;
    goto LAB_001ea81e;
  case VK_FORMAT_R8G8_SRGB:
    VVar4 = s_USCALED;
    goto LAB_001ea79d;
  case VK_FORMAT_R8G8B8_UNORM:
    VVar4 = s_SSCALED;
    goto LAB_001e9f19;
  case VK_FORMAT_R8G8B8_SNORM:
    VVar4 = s_SSCALED;
    goto LAB_001ea77d;
  case VK_FORMAT_R8G8B8_USCALED:
    VVar4 = s_SSCALED;
    goto LAB_001ea645;
  case VK_FORMAT_R8G8B8_SSCALED:
    VVar3 = s_SNORM;
    goto LAB_001ea80f;
  case VK_FORMAT_R8G8B8_UINT:
    VVar4 = s_SSCALED;
LAB_001ea805:
    VVar3 = s_SNORM;
    goto LAB_001ea808;
  case VK_FORMAT_R8G8B8_SINT:
    VVar4 = s_SSCALED;
    goto LAB_001ea81e;
  case VK_FORMAT_R8G8B8_SRGB:
    VVar4 = s_SSCALED;
    goto LAB_001ea79d;
  case VK_FORMAT_B8G8R8_UNORM:
    VVar4 = s_SSCALED;
    goto LAB_001ea7f6;
  case VK_FORMAT_B8G8R8_SNORM:
    VVar4 = s_SSCALED;
    goto LAB_001ea2ff;
  case VK_FORMAT_B8G8R8_USCALED:
    VVar4 = s_SSCALED;
    goto LAB_001e9ed3;
  case VK_FORMAT_B8G8R8_SSCALED:
    VStackY_70 = s_SSCALED;
    goto LAB_001ea65c;
  case VK_FORMAT_B8G8R8_UINT:
    VVar4 = s_SSCALED;
    VStackY_70 = s_UINT;
    goto LAB_001ea758;
  case VK_FORMAT_B8G8R8_SINT:
    VVar4 = s_SSCALED;
    goto LAB_001e9ff8;
  case VK_FORMAT_B8G8R8_SRGB:
    VVar4 = s_SSCALED;
    goto LAB_001ea752;
  case VK_FORMAT_R8G8B8A8_UNORM:
    VVar4 = s_UINT;
LAB_001e9f19:
    VStackY_70 = s_SNORM;
LAB_001ea746:
    VVar2 = s_UNORM;
LAB_001ea748:
    VVar3 = VStackY_70;
    VStackY_70 = s_UNORM;
    goto LAB_001ea877;
  case VK_FORMAT_R8G8B8A8_SNORM:
    VVar4 = s_UINT;
LAB_001ea77d:
    VStackY_70 = s_SNORM;
    goto LAB_001ea783;
  case VK_FORMAT_R8G8B8A8_USCALED:
    VVar4 = s_UINT;
LAB_001ea645:
    VVar3 = s_SNORM;
    VStackY_70 = s_USCALED;
    break;
  case VK_FORMAT_R8G8B8A8_SSCALED:
    VVar4 = s_UINT;
LAB_001ea828:
    VVar3 = s_SNORM;
LAB_001ea82b:
    VStackY_70 = s_SSCALED;
    break;
  case VK_FORMAT_R8G8B8A8_UINT:
    VVar3 = s_SNORM;
    goto LAB_001ea76f;
  case VK_FORMAT_R8G8B8A8_SINT:
    VVar4 = s_UINT;
LAB_001ea81e:
    VVar3 = s_SNORM;
    goto LAB_001ea821;
  case VK_FORMAT_R8G8B8A8_SRGB:
    VVar4 = s_UINT;
LAB_001ea79d:
    VVar3 = s_SNORM;
    VStackY_70 = s_SRGB;
    break;
  case VK_FORMAT_B8G8R8A8_UNORM:
    VVar4 = s_UINT;
LAB_001ea7f6:
    VVar2 = s_SNORM;
    VStackY_70 = VVar2;
    goto LAB_001ea748;
  case VK_FORMAT_B8G8R8A8_SNORM:
    VVar4 = s_UINT;
LAB_001ea2ff:
    VVar2 = s_SNORM;
    VVar3 = VVar2;
    VStackY_70 = VVar2;
    goto LAB_001ea877;
  case VK_FORMAT_B8G8R8A8_USCALED:
    VVar4 = s_UINT;
LAB_001e9ed3:
    VStackY_70 = s_USCALED;
    goto LAB_001ea758;
  case VK_FORMAT_B8G8R8A8_SSCALED:
    VVar4 = s_UINT;
    VStackY_70 = s_SSCALED;
    goto LAB_001ea758;
  case VK_FORMAT_B8G8R8A8_UINT:
    VStackY_70 = s_UINT;
LAB_001ea65c:
    VVar2 = s_SNORM;
    VVar3 = VVar2;
    VVar4 = VStackY_70;
    goto LAB_001ea877;
  case VK_FORMAT_B8G8R8A8_SINT:
    VVar4 = s_UINT;
LAB_001e9ff8:
    VStackY_70 = s_SINT;
    goto LAB_001ea758;
  case VK_FORMAT_B8G8R8A8_SRGB:
    VVar4 = s_UINT;
LAB_001ea752:
    VStackY_70 = s_SRGB;
LAB_001ea758:
    VVar2 = s_SNORM;
    VVar3 = VVar2;
    goto LAB_001ea877;
  case VK_FORMAT_A8B8G8R8_UNORM_PACK32:
    channels[0] = 0;
    channels[1] = 1;
    bits[0] = 8;
    bits[1] = 8;
    goto LAB_001ea8ae;
  case VK_FORMAT_A8B8G8R8_SNORM_PACK32:
    channels[0] = 0;
    channels[1] = 1;
    bits[0] = 8;
    bits[1] = 8;
    goto LAB_001ea572;
  case VK_FORMAT_A8B8G8R8_USCALED_PACK32:
    channels[0] = 0;
    channels[1] = 1;
    bits[0] = 8;
    bits[1] = 8;
    goto LAB_001ea6a4;
  case VK_FORMAT_A8B8G8R8_SSCALED_PACK32:
    channels[0] = 0;
    channels[1] = 1;
    bits[0] = 8;
    bits[1] = 8;
    goto LAB_001ea0d1;
  case VK_FORMAT_A8B8G8R8_UINT_PACK32:
    channels[0] = 0;
    channels[1] = 1;
    bits[0] = 8;
    bits[1] = 8;
    goto LAB_001ea616;
  case VK_FORMAT_A8B8G8R8_SINT_PACK32:
    channels[0] = 0;
    channels[1] = 1;
    bits[0] = 8;
    bits[1] = 8;
    goto LAB_001ea54a;
  case VK_FORMAT_A8B8G8R8_SRGB_PACK32:
    channels_00 = channels;
    channels[0] = 0;
    channels[1] = 1;
    bits_00 = bits;
    bits[0] = 8;
    bits[1] = 8;
    VVar4 = s_UINT;
    VVar3 = s_SRGB;
    goto LAB_001ea8be;
  case VK_FORMAT_A2R10G10B10_UNORM_PACK32:
    channels[0] = 2;
    goto LAB_001ea4ea;
  case VK_FORMAT_A2R10G10B10_SNORM_PACK32:
    channels[0] = 2;
    goto LAB_001ea563;
  case VK_FORMAT_A2R10G10B10_USCALED_PACK32:
    channels[0] = 2;
    goto LAB_001ea695;
  case VK_FORMAT_A2R10G10B10_SSCALED_PACK32:
    channels[0] = 2;
    goto LAB_001ea0c2;
  case VK_FORMAT_A2R10G10B10_UINT_PACK32:
    channels[0] = 2;
    goto LAB_001ea607;
  case VK_FORMAT_A2R10G10B10_SINT_PACK32:
    channels[0] = 2;
    goto LAB_001ea53b;
  case VK_FORMAT_A2B10G10R10_UNORM_PACK32:
    channels[0] = 0;
LAB_001ea4ea:
    channels[1] = 1;
    bits[0] = 10;
    bits[1] = 10;
LAB_001ea8ae:
    VVar4 = s_UINT;
LAB_001ea8b8:
    channels_00 = channels;
    bits_00 = bits;
    VVar3 = s_UNORM;
LAB_001ea8be:
    puVar1 = createDFDPacked(0,VVar4,bits_00,channels_00,VVar3);
    return puVar1;
  case VK_FORMAT_A2B10G10R10_SNORM_PACK32:
    channels[0] = 0;
LAB_001ea563:
    channels[1] = 1;
    bits[0] = 10;
    bits[1] = 10;
LAB_001ea572:
    channels_00 = channels;
    bits_00 = bits;
    VVar4 = s_UINT;
    VVar3 = s_SNORM;
    goto LAB_001ea8be;
  case VK_FORMAT_A2B10G10R10_USCALED_PACK32:
    channels[0] = 0;
LAB_001ea695:
    channels[1] = 1;
    bits[0] = 10;
    bits[1] = 10;
LAB_001ea6a4:
    channels_00 = channels;
    bits_00 = bits;
    VVar4 = s_UINT;
    VVar3 = s_USCALED;
    goto LAB_001ea8be;
  case VK_FORMAT_A2B10G10R10_SSCALED_PACK32:
    channels[0] = 0;
LAB_001ea0c2:
    channels[1] = 1;
    bits[0] = 10;
    bits[1] = 10;
LAB_001ea0d1:
    channels_00 = channels;
    bits_00 = bits;
    VVar4 = s_UINT;
    VVar3 = s_SSCALED;
    goto LAB_001ea8be;
  case VK_FORMAT_A2B10G10R10_UINT_PACK32:
    channels[0] = 0;
LAB_001ea607:
    channels[1] = 1;
    bits[0] = 10;
    bits[1] = 10;
LAB_001ea616:
    channels_00 = channels;
    bits_00 = bits;
    VVar4 = s_UINT;
    VVar3 = VVar4;
    goto LAB_001ea8be;
  case VK_FORMAT_A2B10G10R10_SINT_PACK32:
    channels[0] = 0;
LAB_001ea53b:
    channels[1] = 1;
    bits[0] = 10;
    bits[1] = 10;
LAB_001ea54a:
    channels_00 = channels;
    bits_00 = bits;
    VVar4 = s_UINT;
    VVar3 = s_SINT;
    goto LAB_001ea8be;
  case VK_FORMAT_R16_UNORM:
    VVar4 = s_SNORM;
    goto LAB_001ea740;
  case VK_FORMAT_R16_SNORM:
    VVar3 = s_USCALED;
    VStackY_70 = s_SNORM;
    goto LAB_001ea812;
  case VK_FORMAT_R16_USCALED:
    VVar4 = s_SNORM;
    goto LAB_001ea586;
  case VK_FORMAT_R16_SSCALED:
    VVar4 = s_SNORM;
    goto LAB_001ea765;
  case VK_FORMAT_R16_UINT:
    VVar4 = s_SNORM;
    goto LAB_001e9ea9;
  case VK_FORMAT_R16_SINT:
    VVar4 = s_SNORM;
    goto LAB_001ea736;
  case VK_FORMAT_R16_SFLOAT:
    VVar4 = s_SNORM;
    goto LAB_001ea6e5;
  case VK_FORMAT_R16G16_UNORM:
    VStackY_70 = s_USCALED;
    VVar4 = VStackY_70;
    goto LAB_001ea746;
  case VK_FORMAT_R16G16_SNORM:
    VVar3 = s_USCALED;
    VStackY_70 = s_SNORM;
    VVar4 = VVar3;
    break;
  case VK_FORMAT_R16G16_USCALED:
    VStackY_70 = s_USCALED;
    VVar4 = VStackY_70;
    goto LAB_001ea783;
  case VK_FORMAT_R16G16_SSCALED:
    VVar3 = s_USCALED;
LAB_001ea793:
    VStackY_70 = s_SSCALED;
    VVar4 = VVar3;
    break;
  case VK_FORMAT_R16G16_UINT:
    VVar3 = s_USCALED;
LAB_001ea704:
    VStackY_70 = s_UINT;
    VVar4 = VVar3;
    break;
  case VK_FORMAT_R16G16_SINT:
    VVar3 = s_USCALED;
    goto LAB_001ea3a2;
  case VK_FORMAT_R16G16_SFLOAT:
    VVar3 = s_USCALED;
    goto LAB_001ea71b;
  case VK_FORMAT_R16G16B16_UNORM:
    VVar4 = s_SSCALED;
    goto LAB_001ea740;
  case VK_FORMAT_R16G16B16_SNORM:
    VVar4 = s_SSCALED;
    goto LAB_001ea7c5;
  case VK_FORMAT_R16G16B16_USCALED:
    VVar4 = s_SSCALED;
    goto LAB_001ea586;
  case VK_FORMAT_R16G16B16_SSCALED:
    VVar3 = s_USCALED;
LAB_001ea80f:
    VStackY_70 = s_SSCALED;
    goto LAB_001ea812;
  case VK_FORMAT_R16G16B16_UINT:
    VVar4 = s_SSCALED;
LAB_001e9ea9:
    VVar3 = s_USCALED;
    goto LAB_001ea808;
  case VK_FORMAT_R16G16B16_SINT:
    VVar4 = s_SSCALED;
    goto LAB_001ea736;
  case VK_FORMAT_R16G16B16_SFLOAT:
    VVar4 = s_SSCALED;
    goto LAB_001ea6e5;
  case VK_FORMAT_R16G16B16A16_UNORM:
    VVar4 = s_UINT;
LAB_001ea740:
    VStackY_70 = s_USCALED;
    goto LAB_001ea746;
  case VK_FORMAT_R16G16B16A16_SNORM:
    VVar4 = s_UINT;
LAB_001ea7c5:
    VVar3 = s_USCALED;
    VStackY_70 = s_SNORM;
    break;
  case VK_FORMAT_R16G16B16A16_USCALED:
    VVar4 = s_UINT;
LAB_001ea586:
    VStackY_70 = s_USCALED;
    goto LAB_001ea783;
  case VK_FORMAT_R16G16B16A16_SSCALED:
    VVar4 = s_UINT;
LAB_001ea765:
    VVar3 = s_USCALED;
    goto LAB_001ea82b;
  case VK_FORMAT_R16G16B16A16_UINT:
    VVar3 = s_USCALED;
    goto LAB_001ea76f;
  case VK_FORMAT_R16G16B16A16_SINT:
    VVar4 = s_UINT;
LAB_001ea736:
    VVar3 = s_USCALED;
    goto LAB_001ea821;
  case VK_FORMAT_R16G16B16A16_SFLOAT:
    VVar4 = s_UINT;
LAB_001ea6e5:
    VVar3 = s_USCALED;
    goto LAB_001ea711;
  case VK_FORMAT_R32_UINT:
    VVar4 = s_SNORM;
    goto LAB_001ea52c;
  case VK_FORMAT_R32_SINT:
    VVar4 = s_SNORM;
    goto LAB_001ea518;
  case VK_FORMAT_R32_SFLOAT:
    VVar4 = s_SNORM;
    goto LAB_001ea70e;
  case VK_FORMAT_R32G32_UINT:
    VVar4 = s_USCALED;
    goto LAB_001ea52c;
  case VK_FORMAT_R32G32_SINT:
    VVar4 = s_USCALED;
    goto LAB_001ea518;
  case VK_FORMAT_R32G32_SFLOAT:
    VVar4 = s_USCALED;
    goto LAB_001ea70e;
  case VK_FORMAT_R32G32B32_UINT:
    VVar4 = s_SSCALED;
LAB_001ea52c:
    VStackY_70 = s_UINT;
    goto LAB_001ea783;
  case VK_FORMAT_R32G32B32_SINT:
    VVar4 = s_SSCALED;
LAB_001ea518:
    VVar3 = s_UINT;
    goto LAB_001ea821;
  case VK_FORMAT_R32G32B32_SFLOAT:
    VVar4 = s_SSCALED;
LAB_001ea70e:
    VVar3 = s_UINT;
    goto LAB_001ea711;
  case VK_FORMAT_R32G32B32A32_UINT:
    VStackY_70 = s_UINT;
    VVar4 = VStackY_70;
LAB_001ea783:
    VVar2 = s_UNORM;
    VVar3 = VStackY_70;
    goto LAB_001ea877;
  case VK_FORMAT_R32G32B32A32_SINT:
    VVar3 = s_UINT;
LAB_001ea3a2:
    VStackY_70 = s_SINT;
    VVar4 = VVar3;
    break;
  case VK_FORMAT_R32G32B32A32_SFLOAT:
    VVar3 = s_UINT;
LAB_001ea71b:
    VStackY_70 = s_SFLOAT;
    VVar4 = VVar3;
    break;
  case VK_FORMAT_R64_UINT:
    VVar4 = s_SNORM;
    goto LAB_001ea725;
  case VK_FORMAT_R64_SINT:
    VVar4 = s_SNORM;
    goto LAB_001ea6d4;
  case VK_FORMAT_R64_SFLOAT:
    VVar4 = s_SNORM;
    goto LAB_001ea668;
  case VK_FORMAT_R64G64_UINT:
    VVar4 = s_USCALED;
    goto LAB_001ea725;
  case VK_FORMAT_R64G64_SINT:
    VVar4 = s_USCALED;
    goto LAB_001ea6d4;
  case VK_FORMAT_R64G64_SFLOAT:
    VVar4 = s_USCALED;
    goto LAB_001ea668;
  case VK_FORMAT_R64G64B64_UINT:
    VVar4 = s_SSCALED;
LAB_001ea725:
    VVar3 = s_SRGB;
LAB_001ea808:
    VStackY_70 = s_UINT;
    break;
  case VK_FORMAT_R64G64B64_SINT:
    VVar4 = s_SSCALED;
    goto LAB_001ea6d4;
  case VK_FORMAT_R64G64B64_SFLOAT:
    VVar4 = s_SSCALED;
    goto LAB_001ea668;
  case VK_FORMAT_R64G64B64A64_UINT:
    VVar3 = s_SRGB;
LAB_001ea76f:
    VStackY_70 = s_UINT;
LAB_001ea812:
    VVar2 = s_UNORM;
    VVar4 = VStackY_70;
    goto LAB_001ea877;
  case VK_FORMAT_R64G64B64A64_SINT:
    VVar4 = s_UINT;
LAB_001ea6d4:
    VVar3 = s_SRGB;
LAB_001ea821:
    VStackY_70 = s_SINT;
    break;
  case VK_FORMAT_R64G64B64A64_SFLOAT:
    VVar4 = s_UINT;
LAB_001ea668:
    VVar3 = s_SRGB;
LAB_001ea711:
    VStackY_70 = s_SFLOAT;
    break;
  case VK_FORMAT_B10G11R11_UFLOAT_PACK32:
    channels_00 = channels;
    channels[0] = 0;
    channels[1] = 1;
    bits_00 = bits;
    bits[0] = 0xb;
    bits[1] = 0xb;
    VVar4 = s_SSCALED;
    goto LAB_001ea40d;
  case VK_FORMAT_E5B9G9R9_UFLOAT_PACK32:
    bits_00 = channels;
    channels = (int  [2])((ulong)(uint)channels[1] << 0x20);
    channels_00 = bits;
    bits = (int  [2])((ulong)(uint)bits[1] << 0x20);
    VVar4 = s_SFLOAT;
LAB_001ea40d:
    VVar3 = s_UFLOAT;
    goto LAB_001ea8be;
  case VK_FORMAT_D16_UNORM:
    iVar5 = 0x10;
    VStackY_70 = 2;
    goto LAB_001ea5c1;
  case VK_FORMAT_X8_D24_UNORM_PACK32:
    iVar5 = 0x18;
    goto LAB_001ea5be;
  case VK_FORMAT_D32_SFLOAT:
    iVar5 = 0x20;
LAB_001ea5be:
    VStackY_70 = 4;
LAB_001ea5c1:
    stencilBits = 0;
LAB_001ea679:
    puVar1 = createDFDDepthStencil(iVar5,stencilBits,VStackY_70);
    return puVar1;
  case VK_FORMAT_S8_UINT:
    stencilBits = 8;
    VStackY_70 = 1;
    iVar5 = 0;
    goto LAB_001ea679;
  case VK_FORMAT_D16_UNORM_S8_UINT:
    iVar5 = 0x10;
    goto LAB_001ea672;
  case VK_FORMAT_D24_UNORM_S8_UINT:
    iVar5 = 0x18;
LAB_001ea672:
    stencilBits = 8;
    VStackY_70 = 4;
    goto LAB_001ea679;
  case VK_FORMAT_D32_SFLOAT_S8_UINT:
    iVar5 = 0x20;
    VStackY_70 = 8;
    stencilBits = VStackY_70;
    goto LAB_001ea679;
  case VK_FORMAT_BC1_RGB_UNORM_BLOCK:
    VVar3 = s_UINT;
    VVar4 = s_UNORM;
    bdepth = s_SNORM;
    VStackY_70 = VVar3;
    goto LAB_001ea893;
  case VK_FORMAT_BC1_RGB_SRGB_BLOCK:
    VVar3 = s_UINT;
    bdepth = s_SNORM;
    VStackY_70 = s_SRGB;
    VVar4 = s_UNORM;
    VVar2 = VVar3;
    goto LAB_001ea8d7;
  case VK_FORMAT_BC1_RGBA_UNORM_BLOCK:
    VVar3 = s_UINT;
    VVar4 = s_SNORM;
    bdepth = VVar4;
    VStackY_70 = VVar3;
    goto LAB_001ea893;
  case VK_FORMAT_BC1_RGBA_SRGB_BLOCK:
    VVar3 = s_UINT;
    bdepth = s_SNORM;
    VStackY_70 = s_SRGB;
    VVar2 = VVar3;
    VVar4 = bdepth;
    goto LAB_001ea8d7;
  case VK_FORMAT_BC2_UNORM_BLOCK:
    VVar4 = s_USCALED;
    goto LAB_001ea88a;
  case VK_FORMAT_BC2_SRGB_BLOCK:
    VVar4 = s_USCALED;
    goto LAB_001ea8ca;
  case VK_FORMAT_BC3_UNORM_BLOCK:
    VVar4 = s_SSCALED;
    goto LAB_001ea88a;
  case VK_FORMAT_BC3_SRGB_BLOCK:
    VVar4 = s_SSCALED;
    goto LAB_001ea8ca;
  case VK_FORMAT_BC4_UNORM_BLOCK:
    VVar3 = s_UINT;
    bdepth = s_SNORM;
    VStackY_70 = VVar3;
    VVar4 = VVar3;
    goto LAB_001ea893;
  case VK_FORMAT_BC4_SNORM_BLOCK:
    VVar3 = s_UINT;
    bdepth = s_SNORM;
    VVar2 = VVar3;
    VVar4 = VVar3;
    VStackY_70 = bdepth;
    goto LAB_001ea8d7;
  case VK_FORMAT_BC5_UNORM_BLOCK:
    VVar4 = s_SINT;
    goto LAB_001ea88a;
  case VK_FORMAT_BC5_SNORM_BLOCK:
    VVar4 = s_SINT;
    goto LAB_001ea5e8;
  case VK_FORMAT_BC6H_UFLOAT_BLOCK:
    VVar4 = s_SFLOAT;
    VVar3 = s_UINT;
    bdepth = s_SNORM;
    VStackY_70 = s_UFLOAT;
    VVar2 = VVar3;
    goto LAB_001ea8d7;
  case VK_FORMAT_BC6H_SFLOAT_BLOCK:
    VStackY_70 = s_SFLOAT;
    goto LAB_001ea216;
  case VK_FORMAT_BC7_UNORM_BLOCK:
    VVar4 = s_UFLOAT;
    goto LAB_001ea88a;
  case VK_FORMAT_BC7_SRGB_BLOCK:
    VVar4 = s_UFLOAT;
    goto LAB_001ea8ca;
  case VK_FORMAT_ETC2_R8G8B8_UNORM_BLOCK:
    VVar4 = s_SRGB;
    goto LAB_001ea88a;
  case VK_FORMAT_ETC2_R8G8B8_SRGB_BLOCK:
    VStackY_70 = s_SRGB;
LAB_001ea216:
    bdepth = s_SNORM;
    VVar3 = s_UINT;
    VVar2 = s_UINT;
    VVar4 = VStackY_70;
    goto LAB_001ea8d7;
  case VK_FORMAT_ETC2_R8G8B8A1_UNORM_BLOCK:
    VVar4 = s_SFIXED5;
    goto LAB_001ea88a;
  case VK_FORMAT_ETC2_R8G8B8A1_SRGB_BLOCK:
    VVar4 = s_SFIXED5;
    goto LAB_001ea8ca;
  case VK_FORMAT_ETC2_R8G8B8A8_UNORM_BLOCK:
    VVar4 = s_SRGB|s_USCALED;
    goto LAB_001ea88a;
  case VK_FORMAT_ETC2_R8G8B8A8_SRGB_BLOCK:
    VVar4 = s_SRGB|s_USCALED;
    goto LAB_001ea8ca;
  case VK_FORMAT_EAC_R11_UNORM_BLOCK:
    VVar4 = s_SRGB|s_SSCALED;
    goto LAB_001ea88a;
  case VK_FORMAT_EAC_R11_SNORM_BLOCK:
    VVar4 = s_SRGB|s_SSCALED;
    goto LAB_001ea5e8;
  case VK_FORMAT_EAC_R11G11_UNORM_BLOCK:
    VVar4 = s_SRGB|s_UINT;
    goto LAB_001ea88a;
  case VK_FORMAT_EAC_R11G11_SNORM_BLOCK:
    VVar4 = s_SRGB|s_UINT;
LAB_001ea5e8:
    bdepth = s_SNORM;
    VVar3 = s_UINT;
    VVar2 = s_UINT;
    VStackY_70 = bdepth;
    goto LAB_001ea8d7;
  case VK_FORMAT_ASTC_4x4_UNORM_BLOCK:
    VVar4 = s_SRGB|s_SINT;
LAB_001ea88a:
    VVar3 = s_UINT;
LAB_001ea88d:
    VStackY_70 = s_SNORM;
    bdepth = VStackY_70;
    VStackY_70 = VVar3;
LAB_001ea893:
    VVar2 = VStackY_70;
    VStackY_70 = s_UNORM;
LAB_001ea8d7:
    puVar1 = createDFDCompressed(VVar4,VVar2,VVar3,bdepth,VStackY_70);
    return puVar1;
  case VK_FORMAT_ASTC_4x4_SRGB_BLOCK:
    VVar4 = s_SRGB|s_SINT;
LAB_001ea8ca:
    VVar3 = s_UINT;
LAB_001ea8cd:
    bdepth = s_SNORM;
LAB_001ea8d0:
    VStackY_70 = s_SRGB;
    VVar2 = VVar3;
    goto LAB_001ea8d7;
  case VK_FORMAT_ASTC_5x4_UNORM_BLOCK:
    VVar4 = s_SRGB|s_SINT;
    VStackY_70 = s_SINT;
    goto LAB_001ea861;
  case VK_FORMAT_ASTC_5x4_SRGB_BLOCK:
    VVar2 = s_SINT;
    VVar3 = s_UINT;
    goto LAB_001ea459;
  case VK_FORMAT_ASTC_5x5_UNORM_BLOCK:
    VVar4 = s_SRGB|s_SINT;
    VVar3 = s_SINT;
    goto LAB_001ea88d;
  case VK_FORMAT_ASTC_5x5_SRGB_BLOCK:
    VVar4 = s_SRGB|s_SINT;
    VVar3 = s_SINT;
    goto LAB_001ea8cd;
  case VK_FORMAT_ASTC_6x5_UNORM_BLOCK:
    VStackY_70 = s_SFLOAT;
    goto LAB_001ea41a;
  case VK_FORMAT_ASTC_6x5_SRGB_BLOCK:
    VVar2 = s_SFLOAT;
    goto LAB_001ea44c;
  case VK_FORMAT_ASTC_6x6_UNORM_BLOCK:
    VVar4 = s_SRGB|s_SINT;
    VVar3 = s_SFLOAT;
    goto LAB_001ea88d;
  case VK_FORMAT_ASTC_6x6_SRGB_BLOCK:
    VVar4 = s_SRGB|s_SINT;
    VVar3 = s_SFLOAT;
    goto LAB_001ea8cd;
  case VK_FORMAT_ASTC_8x5_UNORM_BLOCK:
    VStackY_70 = s_SRGB;
    goto LAB_001ea41a;
  case VK_FORMAT_ASTC_8x5_SRGB_BLOCK:
    VVar4 = s_SRGB|s_SINT;
    VVar3 = s_SINT;
    goto LAB_001ea8e5;
  case VK_FORMAT_ASTC_8x6_UNORM_BLOCK:
    VStackY_70 = s_SRGB;
    goto LAB_001ea321;
  case VK_FORMAT_ASTC_8x6_SRGB_BLOCK:
    VVar4 = s_SRGB|s_SINT;
    VVar3 = s_SFLOAT;
LAB_001ea8e5:
    VStackY_70 = s_SRGB;
LAB_001ea8eb:
    bdepth = s_SNORM;
    VVar2 = VStackY_70;
    goto LAB_001ea8d7;
  case VK_FORMAT_ASTC_8x8_UNORM_BLOCK:
    VVar4 = s_SRGB|s_SINT;
    VVar3 = s_SRGB;
    goto LAB_001ea88d;
  case VK_FORMAT_ASTC_8x8_SRGB_BLOCK:
    bdepth = s_SNORM;
    VStackY_70 = s_SRGB;
    VVar2 = VStackY_70;
    goto LAB_001ea5d4;
  case VK_FORMAT_ASTC_10x5_UNORM_BLOCK:
    VStackY_70 = s_SRGB|s_USCALED;
LAB_001ea41a:
    VVar4 = s_SRGB|s_SINT;
    VVar3 = s_SINT;
    goto LAB_001ea864;
  case VK_FORMAT_ASTC_10x5_SRGB_BLOCK:
    VVar2 = s_SRGB|s_USCALED;
LAB_001ea44c:
    VVar3 = s_SINT;
    goto LAB_001ea459;
  case VK_FORMAT_ASTC_10x6_UNORM_BLOCK:
    VStackY_70 = s_SRGB|s_USCALED;
LAB_001ea321:
    VVar4 = s_SRGB|s_SINT;
    VVar3 = s_SFLOAT;
    goto LAB_001ea864;
  case VK_FORMAT_ASTC_10x6_SRGB_BLOCK:
    VVar2 = s_SRGB|s_USCALED;
    VVar3 = s_SFLOAT;
    goto LAB_001ea459;
  case VK_FORMAT_ASTC_10x8_UNORM_BLOCK:
    VVar4 = s_SRGB|s_SINT;
    VStackY_70 = s_SRGB|s_USCALED;
    VVar3 = s_SRGB;
    goto LAB_001ea864;
  case VK_FORMAT_ASTC_10x8_SRGB_BLOCK:
    VVar2 = s_SRGB|s_USCALED;
    VStackY_70 = s_SRGB;
    goto LAB_001ea437;
  case VK_FORMAT_ASTC_10x10_UNORM_BLOCK:
    VVar4 = s_SRGB|s_SINT;
    VVar3 = s_SRGB|s_USCALED;
    goto LAB_001ea88d;
  case VK_FORMAT_ASTC_10x10_SRGB_BLOCK:
    VVar4 = s_SRGB|s_SINT;
    VVar3 = s_SRGB|s_USCALED;
    goto LAB_001ea8cd;
  case VK_FORMAT_ASTC_12x10_UNORM_BLOCK:
    VVar4 = s_SRGB|s_SINT;
    VStackY_70 = s_SRGB|s_UINT;
    VVar3 = s_SRGB|s_USCALED;
LAB_001ea864:
    bdepth = s_SNORM;
    goto LAB_001ea893;
  case VK_FORMAT_ASTC_12x10_SRGB_BLOCK:
    VVar2 = s_SRGB|s_UINT;
    VVar3 = s_SRGB|s_USCALED;
LAB_001ea459:
    VStackY_70 = s_SRGB;
LAB_001ea45f:
    bdepth = s_SNORM;
    VVar4 = s_SRGB|s_SINT;
    goto LAB_001ea8d7;
  case VK_FORMAT_ASTC_12x12_UNORM_BLOCK:
    VVar4 = s_SRGB|s_SINT;
    VVar3 = s_SRGB|s_UINT;
    goto LAB_001ea88d;
  case VK_FORMAT_ASTC_12x12_SRGB_BLOCK:
    VVar4 = s_SRGB|s_SINT;
    VVar3 = s_SRGB|s_UINT;
    goto LAB_001ea8cd;
  default:
    switch(format) {
    case VK_FORMAT_ASTC_3x3x3_UNORM_BLOCK_EXT:
      VStackY_70 = s_SSCALED;
      VVar3 = VStackY_70;
      break;
    case VK_FORMAT_ASTC_3x3x3_SRGB_BLOCK_EXT:
      VVar2 = s_SSCALED;
      goto LAB_001ea49f;
    case VK_FORMAT_ASTC_3x3x3_SFLOAT_BLOCK_EXT:
      VVar2 = s_SSCALED;
      goto LAB_001ea26c;
    case VK_FORMAT_ASTC_4x3x3_UNORM_BLOCK_EXT:
      VStackY_70 = s_SSCALED;
      VVar3 = VStackY_70;
      VStackY_70 = s_UINT;
      break;
    case VK_FORMAT_ASTC_4x3x3_SRGB_BLOCK_EXT:
      VVar2 = s_UINT;
      bdepth = s_SSCALED;
      goto LAB_001ea46e;
    case VK_FORMAT_ASTC_4x3x3_SFLOAT_BLOCK_EXT:
      VVar2 = s_UINT;
      bdepth = s_SSCALED;
      goto LAB_001ea27c;
    case VK_FORMAT_ASTC_4x4x3_UNORM_BLOCK_EXT:
      VVar4 = s_SRGB|s_SINT;
      VVar3 = s_UINT;
      VStackY_70 = s_SSCALED;
      bdepth = VStackY_70;
      VStackY_70 = VVar3;
      goto LAB_001ea893;
    case VK_FORMAT_ASTC_4x4x3_SRGB_BLOCK_EXT:
      VVar4 = s_SRGB|s_SINT;
      VVar3 = s_UINT;
      bdepth = s_SSCALED;
      goto LAB_001ea8d0;
    case VK_FORMAT_ASTC_4x4x3_SFLOAT_BLOCK_EXT:
      VVar3 = s_UINT;
      bdepth = s_SSCALED;
      goto LAB_001ea1b7;
    case VK_FORMAT_ASTC_4x4x4_UNORM_BLOCK_EXT:
      VStackY_70 = s_UINT;
      VVar3 = VStackY_70;
      break;
    case VK_FORMAT_ASTC_4x4x4_SRGB_BLOCK_EXT:
      VVar2 = s_UINT;
      goto LAB_001ea49f;
    case VK_FORMAT_ASTC_4x4x4_SFLOAT_BLOCK_EXT:
      VVar2 = s_UINT;
      goto LAB_001ea26c;
    case VK_FORMAT_ASTC_5x4x4_UNORM_BLOCK_EXT:
      VStackY_70 = s_UINT;
      VVar3 = VStackY_70;
      VStackY_70 = s_SINT;
      break;
    case VK_FORMAT_ASTC_5x4x4_SRGB_BLOCK_EXT:
      VVar2 = s_SINT;
      bdepth = s_UINT;
      goto LAB_001ea46e;
    case VK_FORMAT_ASTC_5x4x4_SFLOAT_BLOCK_EXT:
      VVar2 = s_SINT;
      bdepth = s_UINT;
LAB_001ea27c:
      VStackY_70 = s_SFLOAT;
      goto LAB_001ea4a6;
    case VK_FORMAT_ASTC_5x5x4_UNORM_BLOCK_EXT:
      VVar4 = s_SRGB|s_SINT;
      VVar3 = s_SINT;
      VStackY_70 = s_UINT;
      bdepth = VStackY_70;
      VStackY_70 = VVar3;
      goto LAB_001ea893;
    case VK_FORMAT_ASTC_5x5x4_SRGB_BLOCK_EXT:
      VVar4 = s_SRGB|s_SINT;
      VVar3 = s_SINT;
      bdepth = s_UINT;
      goto LAB_001ea8d0;
    case VK_FORMAT_ASTC_5x5x4_SFLOAT_BLOCK_EXT:
      VVar3 = s_SINT;
      bdepth = s_UINT;
      goto LAB_001ea1b7;
    case VK_FORMAT_ASTC_5x5x5_UNORM_BLOCK_EXT:
      VStackY_70 = s_SINT;
      VVar3 = VStackY_70;
      break;
    case VK_FORMAT_ASTC_5x5x5_SRGB_BLOCK_EXT:
      VVar2 = s_SINT;
      goto LAB_001ea49f;
    case VK_FORMAT_ASTC_5x5x5_SFLOAT_BLOCK_EXT:
      VVar2 = s_SINT;
LAB_001ea26c:
      VStackY_70 = s_SFLOAT;
      bdepth = VVar2;
      goto LAB_001ea4a6;
    case VK_FORMAT_ASTC_6x5x5_UNORM_BLOCK_EXT:
      VStackY_70 = s_SINT;
      VVar3 = VStackY_70;
      VStackY_70 = s_SFLOAT;
      break;
    case VK_FORMAT_ASTC_6x5x5_SRGB_BLOCK_EXT:
      VVar2 = s_SFLOAT;
      bdepth = s_SINT;
LAB_001ea46e:
      VStackY_70 = s_SRGB;
      goto LAB_001ea4a6;
    case VK_FORMAT_ASTC_6x5x5_SFLOAT_BLOCK_EXT:
      bdepth = s_SINT;
      VVar3 = bdepth;
      VVar2 = s_SFLOAT;
      VVar4 = s_SRGB|s_SINT;
      VStackY_70 = s_SFLOAT;
      goto LAB_001ea8d7;
    case VK_FORMAT_ASTC_6x6x5_UNORM_BLOCK_EXT:
      VVar4 = s_SRGB|s_SINT;
      VVar3 = s_SFLOAT;
      VStackY_70 = s_SINT;
      bdepth = VStackY_70;
      VStackY_70 = VVar3;
      goto LAB_001ea893;
    case VK_FORMAT_ASTC_6x6x5_SRGB_BLOCK_EXT:
      VVar4 = s_SRGB|s_SINT;
      VVar3 = s_SFLOAT;
      bdepth = s_SINT;
      goto LAB_001ea8d0;
    case VK_FORMAT_ASTC_6x6x5_SFLOAT_BLOCK_EXT:
      bdepth = s_SINT;
LAB_001ea5ce:
      VStackY_70 = s_SFLOAT;
      VVar2 = VStackY_70;
      goto LAB_001ea5d4;
    case VK_FORMAT_ASTC_6x6x6_UNORM_BLOCK_EXT:
      VStackY_70 = s_SFLOAT;
      VVar3 = VStackY_70;
      break;
    case VK_FORMAT_ASTC_6x6x6_SRGB_BLOCK_EXT:
      VVar2 = s_SFLOAT;
LAB_001ea49f:
      VStackY_70 = s_SRGB;
      bdepth = VVar2;
LAB_001ea4a6:
      VVar3 = bdepth;
      VVar4 = s_SRGB|s_SINT;
      goto LAB_001ea8d7;
    case VK_FORMAT_ASTC_6x6x6_SFLOAT_BLOCK_EXT:
      bdepth = s_SFLOAT;
      VVar3 = bdepth;
      VVar2 = bdepth;
      VVar4 = s_SRGB|s_SINT;
      VStackY_70 = bdepth;
      goto LAB_001ea8d7;
    default:
      switch(format) {
      case VK_FORMAT_ASTC_4x4_SFLOAT_BLOCK:
        VVar3 = s_UINT;
        break;
      case VK_FORMAT_ASTC_5x4_SFLOAT_BLOCK:
        VVar2 = s_SINT;
        VVar3 = s_UINT;
        goto LAB_001ea1e8;
      case VK_FORMAT_ASTC_5x5_SFLOAT_BLOCK:
        VVar3 = s_SINT;
        break;
      case VK_FORMAT_ASTC_6x5_SFLOAT_BLOCK:
        VVar4 = s_SRGB|s_SINT;
        VVar3 = s_SINT;
        VStackY_70 = s_SFLOAT;
        goto LAB_001ea8eb;
      case VK_FORMAT_ASTC_6x6_SFLOAT_BLOCK:
        bdepth = s_SNORM;
        goto LAB_001ea5ce;
      case VK_FORMAT_ASTC_8x5_SFLOAT_BLOCK:
        VVar2 = s_SRGB;
        goto LAB_001ea1e5;
      case VK_FORMAT_ASTC_8x6_SFLOAT_BLOCK:
        VVar2 = s_SRGB;
        goto LAB_001ea1c4;
      case VK_FORMAT_ASTC_8x8_SFLOAT_BLOCK:
        VVar3 = s_SRGB;
        break;
      case VK_FORMAT_ASTC_10x5_SFLOAT_BLOCK:
        VVar2 = s_SRGB|s_USCALED;
LAB_001ea1e5:
        VVar3 = s_SINT;
        goto LAB_001ea1e8;
      case VK_FORMAT_ASTC_10x6_SFLOAT_BLOCK:
        VVar2 = s_SRGB|s_USCALED;
LAB_001ea1c4:
        VStackY_70 = s_SFLOAT;
LAB_001ea437:
        bdepth = s_SNORM;
LAB_001ea5d4:
        VVar3 = VStackY_70;
        VVar4 = s_SRGB|s_SINT;
        goto LAB_001ea8d7;
      case VK_FORMAT_ASTC_10x8_SFLOAT_BLOCK:
        VVar2 = s_SRGB|s_USCALED;
        VVar3 = s_SRGB;
        goto LAB_001ea1e8;
      case VK_FORMAT_ASTC_10x10_SFLOAT_BLOCK:
        VVar3 = s_SRGB|s_USCALED;
        break;
      case VK_FORMAT_ASTC_12x10_SFLOAT_BLOCK:
        VVar2 = s_SRGB|s_UINT;
        VVar3 = s_SRGB|s_USCALED;
LAB_001ea1e8:
        VStackY_70 = s_SFLOAT;
        goto LAB_001ea45f;
      case VK_FORMAT_ASTC_12x12_SFLOAT_BLOCK:
        VVar3 = s_SRGB|s_UINT;
        break;
      default:
        switch(format) {
        case VK_FORMAT_G8B8G8R8_422_UNORM:
          bits[0] = 8;
          bits[1] = 8;
          goto LAB_001e9d12;
        case VK_FORMAT_B8G8R8G8_422_UNORM:
          bits[0] = 8;
          bits[1] = 8;
          goto LAB_001e9b60;
        case VK_FORMAT_G8_B8_R8_3PLANE_420_UNORM:
        case VK_FORMAT_G8_B8R8_2PLANE_420_UNORM:
        case VK_FORMAT_G8_B8_R8_3PLANE_422_UNORM:
        case VK_FORMAT_G8_B8R8_2PLANE_422_UNORM:
        case VK_FORMAT_G8_B8_R8_3PLANE_444_UNORM:
        case VK_FORMAT_G10X6_B10X6_R10X6_3PLANE_420_UNORM_3PACK16:
        case VK_FORMAT_G10X6_B10X6R10X6_2PLANE_420_UNORM_3PACK16:
        case VK_FORMAT_G10X6_B10X6_R10X6_3PLANE_422_UNORM_3PACK16:
        case VK_FORMAT_G10X6_B10X6R10X6_2PLANE_422_UNORM_3PACK16:
        case VK_FORMAT_G10X6_B10X6_R10X6_3PLANE_444_UNORM_3PACK16:
        case VK_FORMAT_G12X4_B12X4_R12X4_3PLANE_420_UNORM_3PACK16:
        case VK_FORMAT_G12X4_B12X4R12X4_2PLANE_420_UNORM_3PACK16:
        case VK_FORMAT_G12X4_B12X4_R12X4_3PLANE_422_UNORM_3PACK16:
        case VK_FORMAT_G12X4_B12X4R12X4_2PLANE_422_UNORM_3PACK16:
        case VK_FORMAT_G12X4_B12X4_R12X4_3PLANE_444_UNORM_3PACK16:
          return (uint32_t *)0x0;
        case VK_FORMAT_R10X6_UNORM_PACK16:
          bits[0] = 10;
          shiftBits[0] = 6;
          goto LAB_001e9b8f;
        case VK_FORMAT_R10X6G10X6_UNORM_2PACK16:
          bits[0] = 10;
          bits[1] = 10;
          shiftBits[0] = 6;
          shiftBits[1] = 6;
          goto LAB_001e9ce1;
        case VK_FORMAT_R10X6G10X6B10X6A10X6_UNORM_4PACK16:
          bits[0] = 10;
          bits[1] = 10;
          shiftBits[0] = 6;
          shiftBits[1] = 6;
          shiftBits[2] = 6;
          shiftBits[3] = 6;
          goto LAB_001e9be4;
        case VK_FORMAT_G10X6B10X6G10X6R10X6_422_UNORM_4PACK16:
          bits[0] = 10;
          bits[1] = 10;
          shiftBits[0] = 6;
          shiftBits[1] = 6;
          shiftBits[2] = 6;
          shiftBits[3] = 6;
          break;
        case VK_FORMAT_B10X6G10X6R10X6G10X6_422_UNORM_4PACK16:
          bits[0] = 10;
          bits[1] = 10;
          shiftBits[0] = 6;
          shiftBits[1] = 6;
          shiftBits[2] = 6;
          shiftBits[3] = 6;
          goto LAB_001e9c19;
        case VK_FORMAT_R12X4_UNORM_PACK16:
          bits[0] = 0xc;
          shiftBits[0] = 4;
LAB_001e9b8f:
          channels = (int  [2])((ulong)(uint)channels[1] << 0x20);
          iVar5 = 1;
LAB_001e9ceb:
          puVar1 = createDFDPackedShifted(0,iVar5,bits,shiftBits,channels,s_UNORM);
          return puVar1;
        case VK_FORMAT_R12X4G12X4_UNORM_2PACK16:
          bits[0] = 0xc;
          bits[1] = 0xc;
          shiftBits[0] = 4;
          shiftBits[1] = 4;
LAB_001e9ce1:
          channels[0] = 0;
          channels[1] = 1;
          iVar5 = 2;
          goto LAB_001e9ceb;
        case VK_FORMAT_R12X4G12X4B12X4A12X4_UNORM_4PACK16:
          bits[0] = 0xc;
          bits[1] = 0xc;
          shiftBits[0] = 4;
          shiftBits[1] = 4;
          shiftBits[2] = 4;
          shiftBits[3] = 4;
LAB_001e9be4:
          channels[0] = 0;
          channels[1] = 1;
          iVar5 = 4;
          goto LAB_001e9ceb;
        case VK_FORMAT_G12X4B12X4G12X4R12X4_422_UNORM_4PACK16:
          bits[0] = 0xc;
          bits[1] = 0xc;
          shiftBits[0] = 4;
          shiftBits[1] = 4;
          shiftBits[2] = 4;
          shiftBits[3] = 4;
          break;
        case VK_FORMAT_B12X4G12X4R12X4G12X4_422_UNORM_4PACK16:
          bits[0] = 0xc;
          bits[1] = 0xc;
          shiftBits[0] = 4;
          shiftBits[1] = 4;
          shiftBits[2] = 4;
          shiftBits[3] = 4;
          goto LAB_001e9c19;
        case VK_FORMAT_G16B16G16R16_422_UNORM:
          bits[0] = 0x10;
          bits[1] = 0x10;
LAB_001e9d12:
          shiftBits[0] = 0;
          shiftBits[1] = 0;
          shiftBits[2] = 0;
          shiftBits[3] = 0;
          break;
        case VK_FORMAT_B16G16R16G16_422_UNORM:
          bits[0] = 0x10;
          bits[1] = 0x10;
LAB_001e9b60:
          shiftBits[0] = 0;
          shiftBits[1] = 0;
          shiftBits[2] = 0;
          shiftBits[3] = 0;
LAB_001e9c19:
          channels[0] = 1;
          channels[1] = 0;
          position_xs[2] = 0x40;
          position_xs[3] = 0xc0;
          goto LAB_001e9d2c;
        default:
          switch(format) {
          case VK_FORMAT_PVRTC1_2BPP_UNORM_BLOCK_IMG:
            VVar4 = s_SRGB|s_UFLOAT;
            goto LAB_001ea85e;
          case VK_FORMAT_PVRTC1_4BPP_UNORM_BLOCK_IMG:
            VVar4 = s_SRGB|s_UFLOAT;
            break;
          case VK_FORMAT_PVRTC2_2BPP_UNORM_BLOCK_IMG:
            VVar4 = 0x10;
LAB_001ea85e:
            VStackY_70 = s_SRGB;
LAB_001ea861:
            VVar3 = s_UINT;
            goto LAB_001ea864;
          case VK_FORMAT_PVRTC2_4BPP_UNORM_BLOCK_IMG:
            VVar4 = 0x10;
            break;
          case VK_FORMAT_PVRTC1_2BPP_SRGB_BLOCK_IMG:
            VVar4 = s_SRGB|s_UFLOAT;
            goto LAB_001ea8e2;
          case VK_FORMAT_PVRTC1_4BPP_SRGB_BLOCK_IMG:
            VVar4 = s_SRGB|s_UFLOAT;
            goto LAB_001ea8ca;
          case VK_FORMAT_PVRTC2_2BPP_SRGB_BLOCK_IMG:
            VVar4 = 0x10;
LAB_001ea8e2:
            VVar3 = s_UINT;
            goto LAB_001ea8e5;
          case VK_FORMAT_PVRTC2_4BPP_SRGB_BLOCK_IMG:
            VVar4 = 0x10;
            goto LAB_001ea8ca;
          default:
            if (format == VK_FORMAT_A4R4G4B4_UNORM_PACK16) {
              channels[0] = 2;
              channels[1] = 1;
            }
            else {
              if (format != VK_FORMAT_A4B4G4R4_UNORM_PACK16) {
                if (format == VK_FORMAT_R16G16_S10_5_NV) {
                  VVar3 = s_USCALED;
                  VStackY_70 = s_SFIXED5;
                  VVar4 = VVar3;
                  goto LAB_001ea875;
                }
                if (format != VK_FORMAT_A1B5G5R5_UNORM_PACK16_KHR) {
                  if (format != VK_FORMAT_A8_UNORM_KHR) {
                    return (uint32_t *)0x0;
                  }
                  puVar1 = createDFDAlpha(0,1,s_UNORM);
                  return puVar1;
                }
                channels[0] = 0;
                goto LAB_001ea84b;
              }
              channels[0] = 0;
              channels[1] = 1;
            }
            goto LAB_001ea89f;
          }
          goto LAB_001ea88a;
        }
        channels[0] = 0;
        channels[1] = 1;
        position_xs[2] = 0xc0;
        position_xs[3] = 0x40;
LAB_001e9d2c:
        position_xs[0] = 0x40;
        position_xs[1] = 0x40;
        position_ys[0] = 0x80;
        position_ys[1] = 0x80;
        position_ys[2] = 0x80;
        position_ys[3] = 0x80;
        puVar1 = createDFD422(0,4,bits,shiftBits,channels,position_xs,position_ys,s_UNORM);
        return puVar1;
      }
      bdepth = s_SNORM;
LAB_001ea1b7:
      VVar4 = s_SRGB|s_SINT;
      VStackY_70 = s_SFLOAT;
      VVar2 = VVar3;
      goto LAB_001ea8d7;
    }
    VVar4 = s_SRGB|s_SINT;
    bdepth = VVar3;
    goto LAB_001ea893;
  }
LAB_001ea875:
  VVar2 = s_UNORM;
LAB_001ea877:
  puVar1 = createDFDUnpacked(0,VVar4,VVar3,VVar2,VStackY_70);
  return puVar1;
}

Assistant:

uint32_t*
vk2dfd(enum VkFormat format)
 {
     switch (format) {
#include "vk2dfd.inl"
         default: return 0;
     }
 }